

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O0

void idx2::Insert<unsigned_int,idx2::channel>(iterator *It,uint *Key,channel *Val)

{
  long lVar1;
  iterator *ItIn;
  long lVar2;
  iterator local_50;
  channel *local_30;
  channel *Val_local;
  uint *Key_local;
  iterator *It_local;
  long local_10;
  
  *It->Key = *Key;
  local_30 = Val;
  Val_local = (channel *)Key;
  Key_local = (uint *)It;
  memcpy(It->Val,Val,0xd4);
  *(undefined1 *)(*(long *)(*(long *)(Key_local + 4) + 0x10) + *(long *)(Key_local + 6)) = 2;
  *(long *)(*(long *)(Key_local + 4) + 0x18) = *(long *)(*(long *)(Key_local + 4) + 0x18) + 1;
  It_local = *(iterator **)(Key_local + 4);
  lVar1 = It_local->Idx * 10;
  local_10 = *(long *)(Key_local + 4);
  lVar2 = 1L << ((byte)*(undefined8 *)(local_10 + 0x20) & 0x3f);
  ItIn = (iterator *)(lVar2 * 7);
  if (SBORROW8(lVar1,(long)ItIn) == lVar1 + lVar2 * -7 < 0) {
    IncreaseCapacity<unsigned_int,idx2::channel>
              (&local_50,*(idx2 **)(Key_local + 4),
               (hash_table<unsigned_int,_idx2::channel> *)Key_local,ItIn);
    *(uint **)Key_local = local_50.Key;
    *(channel **)(Key_local + 2) = local_50.Val;
    *(hash_table<unsigned_int,_idx2::channel> **)(Key_local + 4) = local_50.Ht;
    *(i64 *)(Key_local + 6) = local_50.Idx;
  }
  return;
}

Assistant:

void
Insert(typename hash_table<k, v>::iterator* It, const k& Key, const v& Val)
{
  idx2_Assert((*It) != End(*(It->Ht)));
  *(It->Key) = Key;
  *(It->Val) = Val;
  It->Ht->Stats[It->Idx] = hash_table<k, v>::Occupied;
  ++It->Ht->Size;

  if (Size(*(It->Ht)) * 10 >= Capacity(*(It->Ht)) * 7)
  {
    *(It) = IncreaseCapacity(It->Ht, *It);
  }
}